

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib670.c
# Opt level: O2

size_t read_callback(char *ptr,size_t size,size_t nmemb,void *userp)

{
  int iVar1;
  size_t sVar2;
  time_t tVar3;
  
  if (size * nmemb == 0) {
switchD_001015c9_caseD_3:
    sVar2 = 0;
  }
  else {
    iVar1 = *(int *)((long)userp + 0x10);
    *(int *)((long)userp + 0x10) = iVar1 + 1;
    switch(iVar1) {
    case 0:
      *ptr = 'A';
      break;
    case 1:
      tVar3 = time((time_t *)0x0);
      *(time_t *)((long)userp + 8) = tVar3;
      return 0x10000001;
    case 2:
      tVar3 = time((time_t *)0x0);
      *ptr = (1 < tVar3 - *(long *)((long)userp + 8)) + 'A';
      break;
    case 3:
      goto switchD_001015c9_caseD_3;
    default:
      curl_mfprintf(_stderr,"Read callback called after EOF\n");
      exit(1);
    }
    sVar2 = 1;
  }
  return sVar2;
}

Assistant:

static size_t read_callback(char *ptr, size_t size, size_t nmemb, void *userp)
{
  struct ReadThis *pooh = (struct ReadThis *) userp;
  time_t delta;

  if(size * nmemb < 1)
    return 0;

  switch(pooh->count++) {
  case 0:
    *ptr = '\x41'; /* ASCII A. */
    return 1;
  case 1:
    pooh->origin = time(NULL);
    return CURL_READFUNC_PAUSE;
  case 2:
    delta = time(NULL) - pooh->origin;
    *ptr = delta >= PAUSE_TIME? '\x42': '\x41'; /* ASCII A or B. */
    return 1;
  case 3:
    return 0;
  }
  fprintf(stderr, "Read callback called after EOF\n");
  exit(1);
}